

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O2

void aom_highbd_convolve8_vert_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  uint16_t uVar1;
  ulong uVar2;
  ushort *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  lVar10 = (long)dst * 2;
  lVar6 = src_stride * -6 + (long)src * 2;
  uVar2 = 0;
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = uVar2;
  }
  if (w < 1) {
    w = 0;
  }
  for (; (int)uVar2 != w; uVar2 = (ulong)((int)uVar2 + 1)) {
    uVar8 = (uint)((ulong)filter_y >> 4) & 0xf;
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      puVar3 = (ushort *)((long)((int)uVar8 >> 4) * src_stride * 2 + lVar6);
      iVar7 = 0;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        iVar7 = iVar7 + (int)*(short *)((ulong)((uVar8 & 0xf) << 4) +
                                        ((ulong)filter_y & 0xffffffffffffff00) + lVar4 * 2) *
                        (uint)*puVar3;
        puVar3 = puVar3 + src_stride;
      }
      uVar1 = clip_pixel_highbd(iVar7 + 0x40 >> 7,bd);
      *(uint16_t *)(lVar10 + uVar5 * dst_stride * 2) = uVar1;
      uVar8 = uVar8 + y_step_q4;
    }
    lVar6 = lVar6 + 2;
    lVar10 = lVar10 + 2;
  }
  return;
}

Assistant:

void aom_highbd_convolve8_vert_c(const uint8_t *src, ptrdiff_t src_stride,
                                 uint8_t *dst, ptrdiff_t dst_stride,
                                 const int16_t *filter_x, int x_step_q4,
                                 const int16_t *filter_y, int y_step_q4, int w,
                                 int h, int bd) {
  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);
  (void)filter_x;
  (void)x_step_q4;

  highbd_convolve_vert(src, src_stride, dst, dst_stride, filters_y, y0_q4,
                       y_step_q4, w, h, bd);
}